

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_3885c::JSONParser::~JSONParser(JSONParser *this)

{
  JSONParser *this_local;
  
  std::__cxx11::string::~string((string *)&this->dict_key);
  std::
  vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  ::~vector(&this->stack);
  std::__cxx11::string::~string((string *)&this->token);
  return;
}

Assistant:

JSONParser(InputSource& is, JSON::Reactor* reactor) :
            is(is),
            reactor(reactor),
            p(buf)
        {
        }